

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O2

void libtorrent::dht::anon_unknown_20::get_mutable_item_callback
               (item *it,bool authoritative,
               shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx> *ctx,
               function<void_(const_libtorrent::dht::item_&,_bool)> *f)

{
  bool bVar1;
  undefined7 in_register_00000031;
  element_type *peVar2;
  bool __args_1;
  
  peVar2 = (ctx->
           super___shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if ((int)CONCAT71(in_register_00000031,authoritative) == 0) {
    __args_1 = false;
  }
  else {
    peVar2->active_traversals = peVar2->active_traversals + -1;
    __args_1 = peVar2->active_traversals == 0;
  }
  bVar1 = item::empty(&peVar2->it);
  if (bVar1) {
    bVar1 = item::empty(it);
    if (bVar1) goto LAB_003551fd;
    peVar2 = (ctx->
             super___shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  }
  else {
LAB_003551fd:
    peVar2 = (ctx->
             super___shared_ptr<libtorrent::dht::(anonymous_namespace)::get_mutable_item_ctx,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    if ((it->m_seq).value <= (peVar2->it).m_seq.value) {
      bVar1 = __args_1 == false;
      __args_1 = true;
      if (bVar1) {
        return;
      }
      goto LAB_00355232;
    }
  }
  item::operator=(&peVar2->it,it);
LAB_00355232:
  ::std::function<void_(const_libtorrent::dht::item_&,_bool)>::operator()(f,it,__args_1);
  return;
}

Assistant:

void get_mutable_item_callback(item const& it, bool authoritative
		, std::shared_ptr<get_mutable_item_ctx> ctx
		, std::function<void(item const&, bool)> f)
	{
		TORRENT_ASSERT(it.is_mutable());
		if (authoritative) --ctx->active_traversals;
		authoritative = authoritative && ctx->active_traversals == 0;
		if ((ctx->it.empty() && !it.empty()) || (ctx->it.seq() < it.seq()))
		{
			ctx->it = it;
			f(it, authoritative);
		}
		else if (authoritative)
			f(it, authoritative);
	}